

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_test.cc
# Opt level: O2

void __thiscall
PlanTest::FindWorkSorted(PlanTest *this,deque<Edge_*,_std::allocator<Edge_*>_> *ret,int count)

{
  Test *this_00;
  Edge *pEVar1;
  int iVar2;
  bool bVar3;
  Edge *edge;
  _Deque_iterator<Edge_*,_Edge_*&,_Edge_**> local_78;
  _Deque_iterator<Edge_*,_Edge_*&,_Edge_**> local_58;
  
  iVar2 = 0;
  if (0 < count) {
    iVar2 = count;
  }
  while( true ) {
    this_00 = g_current_test;
    bVar3 = iVar2 == 0;
    iVar2 = iVar2 + -1;
    if (bVar3) break;
    bVar3 = testing::Test::Check
                      (g_current_test,
                       0 < (this->plan_).command_edges_ && 0 < (this->plan_).wanted_edges_,
                       "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                       ,0x2d,"plan_.more_to_do()");
    if (!bVar3) goto LAB_0013f257;
    edge = Plan::FindWork(&this->plan_);
    bVar3 = testing::Test::Check
                      (g_current_test,edge != (Edge *)0x0,
                       "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                       ,0x2f,"edge");
    if (!bVar3) goto LAB_0013f257;
    std::deque<Edge_*,_std::allocator<Edge_*>_>::push_back(ret,&edge);
  }
  pEVar1 = Plan::FindWork(&this->plan_);
  bVar3 = testing::Test::Check
                    (this_00,pEVar1 == (Edge *)0x0,
                     "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                     ,0x32,"plan_.FindWork()");
  if (bVar3) {
    local_58._M_cur =
         (ret->super__Deque_base<Edge_*,_std::allocator<Edge_*>_>)._M_impl.super__Deque_impl_data.
         _M_start._M_cur;
    local_58._M_first =
         (ret->super__Deque_base<Edge_*,_std::allocator<Edge_*>_>)._M_impl.super__Deque_impl_data.
         _M_start._M_first;
    local_58._M_last =
         (ret->super__Deque_base<Edge_*,_std::allocator<Edge_*>_>)._M_impl.super__Deque_impl_data.
         _M_start._M_last;
    local_58._M_node =
         (ret->super__Deque_base<Edge_*,_std::allocator<Edge_*>_>)._M_impl.super__Deque_impl_data.
         _M_start._M_node;
    local_78._M_cur =
         (ret->super__Deque_base<Edge_*,_std::allocator<Edge_*>_>)._M_impl.super__Deque_impl_data.
         _M_finish._M_cur;
    local_78._M_first =
         (ret->super__Deque_base<Edge_*,_std::allocator<Edge_*>_>)._M_impl.super__Deque_impl_data.
         _M_finish._M_first;
    local_78._M_last =
         (ret->super__Deque_base<Edge_*,_std::allocator<Edge_*>_>)._M_impl.super__Deque_impl_data.
         _M_finish._M_last;
    local_78._M_node =
         (ret->super__Deque_base<Edge_*,_std::allocator<Edge_*>_>)._M_impl.super__Deque_impl_data.
         _M_finish._M_node;
    std::sort<std::_Deque_iterator<Edge*,Edge*&,Edge**>,bool(*)(Edge_const*,Edge_const*)>
              (&local_58,&local_78,CompareEdgesByOutput::cmp);
  }
  else {
LAB_0013f257:
    g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
  }
  return;
}

Assistant:

void FindWorkSorted(deque<Edge*>* ret, int count) {
    for (int i = 0; i < count; ++i) {
      ASSERT_TRUE(plan_.more_to_do());
      Edge* edge = plan_.FindWork();
      ASSERT_TRUE(edge);
      ret->push_back(edge);
    }
    ASSERT_FALSE(plan_.FindWork());
    sort(ret->begin(), ret->end(), CompareEdgesByOutput::cmp);
  }